

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O0

void aom_smooth_h_predictor_16x64_ssse3
               (uint8_t *dst,ptrdiff_t stride,uint8_t *top_row,uint8_t *left_column)

{
  undefined8 uVar1;
  byte bVar2;
  undefined1 auVar3 [16];
  ushort uVar4;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  undefined8 *in_RDI;
  ushort uVar5;
  ushort uVar6;
  ushort uVar7;
  ushort uVar8;
  ushort uVar10;
  ushort uVar11;
  ushort uVar12;
  ushort uVar13;
  ushort uVar14;
  ushort uVar15;
  ushort uVar16;
  ushort uVar17;
  ushort uVar18;
  ushort uVar19;
  ushort uVar20;
  ushort uVar21;
  ushort uVar22;
  ushort uVar23;
  ushort uVar24;
  ushort uVar25;
  ushort uVar26;
  ushort uVar27;
  ushort uVar28;
  ushort uVar29;
  ushort uVar30;
  ushort uVar31;
  ushort uVar32;
  ushort uVar33;
  undefined1 auVar9 [16];
  ushort uVar34;
  ushort uVar35;
  ushort uVar36;
  ushort uVar37;
  __m128i scaled_top_right1;
  __m128i inverted_weights2;
  __m128i inverted_weights1;
  __m128i weights2;
  __m128i weights1;
  __m128i scale;
  __m128i weights;
  __m128i top_right;
  __m128i pred2;
  __m128i pred1;
  __m128i pred_sum2;
  __m128i pred_sum1;
  __m128i weighted_px2;
  __m128i weighted_px1;
  int local_54c;
  int local_52c;
  undefined8 *local_468;
  byte local_408;
  undefined1 uStack_407;
  undefined1 uStack_406;
  undefined1 uStack_405;
  byte bStack_404;
  undefined1 uStack_403;
  undefined1 uStack_402;
  undefined1 uStack_401;
  ushort uStack_332;
  ushort uStack_32a;
  ushort uStack_316;
  ushort uStack_314;
  ushort uStack_312;
  ushort uStack_30e;
  ushort uStack_30c;
  ushort uStack_30a;
  short local_118;
  short sStack_116;
  short sStack_114;
  short sStack_112;
  short sStack_110;
  short sStack_10e;
  short sStack_10c;
  short sStack_10a;
  __m128i left_y;
  __m128i y_select;
  int y_mask;
  __m128i left;
  int left_offset;
  __m128i round;
  __m128i scaled_top_right2;
  
  bVar2 = *(byte *)(in_RDX + 0xf);
  uVar4 = (ushort)bVar2;
  uStack_316 = (ushort)bVar2;
  uStack_314 = (ushort)bVar2;
  uStack_312 = (ushort)bVar2;
  uStack_30e = (ushort)bVar2;
  uStack_30c = (ushort)bVar2;
  uStack_30a = (ushort)bVar2;
  uStack_332 = (ushort)bVar2;
  uStack_32a = (ushort)bVar2;
  local_468 = in_RDI;
  for (local_52c = 0; local_52c < 0x40; local_52c = local_52c + 8) {
    uVar1 = *(undefined8 *)(in_RCX + local_52c);
    local_408 = (byte)uVar1;
    uStack_407 = (undefined1)((ulong)uVar1 >> 8);
    uStack_406 = (undefined1)((ulong)uVar1 >> 0x10);
    uStack_405 = (undefined1)((ulong)uVar1 >> 0x18);
    bStack_404 = (byte)((ulong)uVar1 >> 0x20);
    uStack_403 = (undefined1)((ulong)uVar1 >> 0x28);
    uStack_402 = (undefined1)((ulong)uVar1 >> 0x30);
    uStack_401 = (undefined1)((ulong)uVar1 >> 0x38);
    for (local_54c = 0x1000100; local_54c < 0xf0e0f0f; local_54c = local_54c + 0x2020202) {
      auVar9._4_4_ = local_54c;
      auVar9._0_4_ = local_54c;
      auVar9._12_4_ = local_54c;
      auVar9._8_4_ = local_54c;
      auVar3[1] = 0;
      auVar3[0] = local_408;
      auVar3[2] = uStack_407;
      auVar3[3] = 0;
      auVar3[4] = uStack_406;
      auVar3[5] = 0;
      auVar3[6] = uStack_405;
      auVar3[7] = 0;
      auVar3[9] = 0;
      auVar3[8] = bStack_404;
      auVar3[10] = uStack_403;
      auVar3[0xb] = 0;
      auVar3[0xc] = uStack_402;
      auVar3[0xd] = 0;
      auVar3[0xe] = uStack_401;
      auVar3[0xf] = 0;
      auVar9 = pshufb(auVar3,auVar9);
      local_118 = auVar9._0_2_;
      sStack_116 = auVar9._2_2_;
      sStack_114 = auVar9._4_2_;
      sStack_112 = auVar9._6_2_;
      sStack_110 = auVar9._8_2_;
      sStack_10e = auVar9._10_2_;
      sStack_10c = auVar9._12_2_;
      sStack_10a = auVar9._14_2_;
      uVar5 = uVar4 + local_118 * 0xff + 0x80;
      uVar10 = uStack_316 * 0x1f + sStack_116 * 0xe1 + 0x80;
      uVar14 = uStack_314 * 0x3c + sStack_114 * 0xc4 + 0x80;
      uVar18 = uStack_312 * 0x56 + sStack_112 * 0xaa + 0x80;
      uVar22 = uVar4 * 0x6f + sStack_110 * 0x91 + 0x80;
      uVar26 = uStack_30e * 0x85 + sStack_10e * 0x7b + 0x80;
      uVar30 = uStack_30c * 0x9a + sStack_10c * 0x66 + 0x80;
      uVar34 = uStack_30a * 0xac + sStack_10a * 0x54 + 0x80;
      uVar6 = uVar5 >> 8;
      uVar11 = uVar10 >> 8;
      uVar15 = uVar14 >> 8;
      uVar19 = uVar18 >> 8;
      uVar23 = uVar22 >> 8;
      uVar27 = uVar26 >> 8;
      uVar31 = uVar30 >> 8;
      uVar35 = uVar34 >> 8;
      uVar7 = uVar4 * 0xbc + local_118 * 0x44 + 0x80;
      uVar12 = uStack_316 * 0xca + sStack_116 * 0x36 + 0x80;
      uVar16 = uStack_314 * 0xd5 + sStack_114 * 0x2b + 0x80;
      uVar20 = uStack_332 * 0xdf + sStack_112 * 0x21 + 0x80;
      uVar24 = uVar4 * 0xe6 + sStack_110 * 0x1a + 0x80;
      uVar28 = uStack_30e * 0xec + sStack_10e * 0x14 + 0x80;
      uVar32 = uStack_30c * 0xef + sStack_10c * 0x11 + 0x80;
      uVar36 = uStack_32a * 0xf0 + sStack_10a * 0x10 + 0x80;
      uVar8 = uVar7 >> 8;
      uVar13 = uVar12 >> 8;
      uVar17 = uVar16 >> 8;
      uVar21 = uVar20 >> 8;
      uVar25 = uVar24 >> 8;
      uVar29 = uVar28 >> 8;
      uVar33 = uVar32 >> 8;
      uVar37 = uVar36 >> 8;
      *local_468 = CONCAT17((uVar35 != 0) * (uVar35 < 0x100) * (char)(uVar34 >> 8) - (0xff < uVar35)
                            ,CONCAT16((uVar31 != 0) * (uVar31 < 0x100) * (char)(uVar30 >> 8) -
                                      (0xff < uVar31),
                                      CONCAT15((uVar27 != 0) * (uVar27 < 0x100) *
                                               (char)(uVar26 >> 8) - (0xff < uVar27),
                                               CONCAT14((uVar23 != 0) * (uVar23 < 0x100) *
                                                        (char)(uVar22 >> 8) - (0xff < uVar23),
                                                        CONCAT13((uVar19 != 0) * (uVar19 < 0x100) *
                                                                 (char)(uVar18 >> 8) -
                                                                 (0xff < uVar19),
                                                                 CONCAT12((uVar15 != 0) *
                                                                          (uVar15 < 0x100) *
                                                                          (char)(uVar14 >> 8) -
                                                                          (0xff < uVar15),
                                                                          CONCAT11((uVar11 != 0) *
                                                                                   (uVar11 < 0x100)
                                                                                   * (char)(uVar10 
                                                  >> 8) - (0xff < uVar11),
                                                  (uVar6 != 0) * (uVar6 < 0x100) *
                                                  (char)(uVar5 >> 8) - (0xff < uVar6))))))));
      local_468[1] = CONCAT17((uVar37 != 0) * (uVar37 < 0x100) * (char)(uVar36 >> 8) -
                              (0xff < uVar37),
                              CONCAT16((uVar33 != 0) * (uVar33 < 0x100) * (char)(uVar32 >> 8) -
                                       (0xff < uVar33),
                                       CONCAT15((uVar29 != 0) * (uVar29 < 0x100) *
                                                (char)(uVar28 >> 8) - (0xff < uVar29),
                                                CONCAT14((uVar25 != 0) * (uVar25 < 0x100) *
                                                         (char)(uVar24 >> 8) - (0xff < uVar25),
                                                         CONCAT13((uVar21 != 0) * (uVar21 < 0x100) *
                                                                  (char)(uVar20 >> 8) -
                                                                  (0xff < uVar21),
                                                                  CONCAT12((uVar17 != 0) *
                                                                           (uVar17 < 0x100) *
                                                                           (char)(uVar16 >> 8) -
                                                                           (0xff < uVar17),
                                                                           CONCAT11((uVar13 != 0) *
                                                                                    (uVar13 < 0x100)
                                                                                    * (char)(uVar12 
                                                  >> 8) - (0xff < uVar13),
                                                  (uVar8 != 0) * (uVar8 < 0x100) *
                                                  (char)(uVar7 >> 8) - (0xff < uVar8))))))));
      local_468 = (undefined8 *)(in_RSI + (long)local_468);
    }
  }
  return;
}

Assistant:

void aom_smooth_h_predictor_16x64_ssse3(
    uint8_t *LIBAOM_RESTRICT dst, ptrdiff_t stride,
    const uint8_t *LIBAOM_RESTRICT top_row,
    const uint8_t *LIBAOM_RESTRICT left_column) {
  const __m128i top_right = _mm_set1_epi16(top_row[15]);
  const __m128i weights = LoadUnaligned16(smooth_weights + 12);
  const __m128i scale = _mm_set1_epi16(1 << SMOOTH_WEIGHT_LOG2_SCALE);
  const __m128i weights1 = cvtepu8_epi16(weights);
  const __m128i weights2 = cvtepu8_epi16(_mm_srli_si128(weights, 8));
  const __m128i inverted_weights1 = _mm_sub_epi16(scale, weights1);
  const __m128i inverted_weights2 = _mm_sub_epi16(scale, weights2);
  const __m128i scaled_top_right1 =
      _mm_mullo_epi16(inverted_weights1, top_right);
  const __m128i scaled_top_right2 =
      _mm_mullo_epi16(inverted_weights2, top_right);
  const __m128i round = _mm_set1_epi16(1 << (SMOOTH_WEIGHT_LOG2_SCALE - 1));
  for (int left_offset = 0; left_offset < 64; left_offset += 8) {
    const __m128i left = cvtepu8_epi16(LoadLo8(left_column + left_offset));
    for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
      const __m128i y_select = _mm_set1_epi32(y_mask);
      const __m128i left_y = _mm_shuffle_epi8(left, y_select);
      write_smooth_directional_sum16(dst, left_y, left_y, weights1, weights2,
                                     scaled_top_right1, scaled_top_right2,
                                     round);
      dst += stride;
    }
  }
}